

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashXor(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (p->fGiaSimple != 0) {
    iVar1 = Abc_LitNot(iLit1);
    iVar1 = Gia_ManHashAnd(p,iLit0,iVar1);
    iVar2 = Abc_LitNot(iLit0);
    iVar2 = Gia_ManHashAnd(p,iVar2,iLit1);
    iVar1 = Gia_ManHashOr(p,iVar1,iVar2);
    return iVar1;
  }
  iVar1 = Abc_LitIsCompl(iLit0);
  iVar2 = Abc_LitIsCompl(iLit1);
  iVar3 = Abc_LitRegular(iLit0);
  iVar4 = Abc_LitRegular(iLit1);
  iVar4 = Abc_LitNot(iVar4);
  iVar3 = Gia_ManHashAnd(p,iVar3,iVar4);
  iVar4 = Abc_LitRegular(iLit1);
  iVar5 = Abc_LitRegular(iLit0);
  iVar5 = Abc_LitNot(iVar5);
  iVar4 = Gia_ManHashAnd(p,iVar4,iVar5);
  iVar3 = Abc_LitNot(iVar3);
  iVar4 = Abc_LitNot(iVar4);
  iVar3 = Gia_ManHashAnd(p,iVar3,iVar4);
  iVar1 = Abc_LitNotCond(iVar3,(uint)(iVar1 == iVar2));
  return iVar1;
}

Assistant:

int Gia_ManHashXor( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( p->fGiaSimple )
        return Gia_ManHashOr(p, Gia_ManHashAnd(p, iLit0, Abc_LitNot(iLit1)), Gia_ManHashAnd(p, Abc_LitNot(iLit0), iLit1) );
    else
    {
        int fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
        int iTemp0 = Gia_ManHashAnd( p, Abc_LitRegular(iLit0), Abc_LitNot(Abc_LitRegular(iLit1)) );
        int iTemp1 = Gia_ManHashAnd( p, Abc_LitRegular(iLit1), Abc_LitNot(Abc_LitRegular(iLit0)) );
        return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
    }
}